

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_labeltype.cxx
# Opt level: O0

void fl_normal_label(Fl_Label *o,int X,int Y,int W,int H,Fl_Align align)

{
  Fl_Align align_local;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Label *o_local;
  
  fl_font(o->font,o->size);
  fl_color(o->color);
  fl_draw(o->value,X,Y,W,H,align,o->image,1);
  return;
}

Assistant:

void
fl_normal_label(const Fl_Label* o, int X, int Y, int W, int H, Fl_Align align)
{
  fl_font(o->font, o->size);
  fl_color((Fl_Color)o->color);
  fl_draw(o->value, X, Y, W, H, align, o->image);
}